

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_daxpy_oe(int n,double alpha,double *x,int incx,double *y,int incy,double *z,int incz)

{
  int local_44;
  int i;
  double *z_local;
  int incy_local;
  double *y_local;
  int incx_local;
  double *x_local;
  double alpha_local;
  int n_local;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x4f,
                  "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y != (double *)0x0) {
    if (z != (double *)0x0) {
      for (local_44 = 0; local_44 < n; local_44 = local_44 + 1) {
        z[local_44 * incz] = alpha * x[local_44 * incx] + y[local_44 * incy];
      }
      return;
    }
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x51,
                  "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x50,
                "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_daxpy_oe(
        int n,
        double alpha,
        const double *x, int incx,
        const double *y, int incy,
        double *z, int incz)
{
    assert(x);
    assert(y);
    assert(z);

    for (int i = 0; i < n; i++) {
        z[i * incz] = alpha * x[i * incx] + y[i * incy];
    }
}